

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::constructBuiltIn
          (TParseContext *this,TType *type,TOperator op,TIntermTyped *node,TSourceLoc *loc,
          bool subset)

{
  TIntermediate *pTVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  TBasicType TVar7;
  TOperator TVar8;
  TBasicType src;
  undefined4 extraout_var;
  ulong uVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TType *pTVar10;
  TType *pTVar11;
  TIntermTyped *pTVar12;
  undefined4 extraout_var_02;
  long lVar13;
  undefined4 extraout_var_03;
  long *plVar14;
  TSourceLoc *pTVar15;
  TParseContext *pTVar16;
  undefined4 extraout_var_04;
  TOperator op_1;
  TIntermTyped *newNode_6;
  TIntermTyped *newNode_5;
  TIntermTyped *newNode_4;
  undefined1 local_428 [4];
  TOperator aggregateOp_4;
  TType tempType_4;
  undefined1 local_388 [4];
  TOperator aggregateOp_3;
  TType tempType_3;
  undefined1 local_2e8 [4];
  TOperator aggregateOp_2;
  TType tempType_2;
  undefined1 local_248 [4];
  TOperator aggregateOp_1;
  TType tempType_1;
  undefined1 local_1a8 [4];
  TOperator aggregateOp;
  TType tempType;
  TIntermTyped *newNode_3;
  TIntermTyped *newNode_2;
  TIntermTyped *newSrcNode;
  TIntermTyped *newNode_1;
  TIntermTyped *pTStack_e8;
  TOperator basicOp;
  TIntermTyped *newNode;
  undefined1 local_d8 [4];
  TOperator transitionOp;
  TType transitionType;
  bool subset_local;
  TSourceLoc *loc_local;
  TIntermTyped *node_local;
  TType *pTStack_20;
  TOperator op_local;
  TType *type_local;
  TParseContext *this_local;
  
  transitionType.spirvType._7_1_ = subset;
  node_local._4_4_ = op;
  pTStack_20 = type;
  type_local = (TType *)this;
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  uVar9 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0xe0))();
  loc_local = (TSourceLoc *)node;
  if (((uVar9 & 1) != 0) &&
     ((uVar5 = (*pTStack_20->_vptr_TType[0x18])(), (uVar5 & 1) != 0 ||
      (uVar5 = (*pTStack_20->_vptr_TType[0x1b])(), (uVar5 & 1) != 0)))) {
    iVar4 = (*pTStack_20->_vptr_TType[0x26])();
    iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x130))();
    if (((byte)iVar4 & 1) != (bVar2 & 1)) {
      TVar7 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
      iVar4 = (*pTStack_20->_vptr_TType[0xc])();
      iVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2b])();
      TType::TType((TType *)local_d8,TVar7,EvqTemporary,iVar4,0,0,(bool)((byte)iVar6 & 1));
      TVar8 = TIntermediate::mapTypeToConstructorOp
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         (TType *)local_d8);
      loc_local = (TSourceLoc *)constructBuiltIn(this,(TType *)local_d8,TVar8,node,loc,false);
      TType::~TType((TType *)local_d8);
    }
  }
  switch(node_local._4_4_) {
  case EOpConstructInt:
  case EOpConstructIVec2:
  case EOpConstructIVec3:
  case EOpConstructIVec4:
    newNode_1._4_4_ = EOpConstructInt;
    break;
  case EOpConstructInt8:
  case EOpConstructI8Vec2:
  case EOpConstructI8Vec3:
  case EOpConstructI8Vec4:
    newNode_1._4_4_ = EOpConstructInt8;
    bVar3 = TIntermediate::getArithemeticInt8Enabled
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    if ((!bVar3) && (iVar4 = (*(code *)loc_local->name[6]._M_string_length)(), iVar4 != 4)) {
      iVar4 = (*pTStack_20->_vptr_TType[0xc])();
      TType::TType((TType *)local_248,EbtInt,EvqTemporary,iVar4,0,0,false);
      pTStack_e8 = (TIntermTyped *)loc_local;
      pTVar10 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      bVar3 = TType::operator!=((TType *)local_248,pTVar10);
      if (bVar3) {
        if (node_local._4_4_ == EOpConstructInt8) {
          tempType_2.spirvType._4_4_ = EOpConstructInt;
        }
        else {
          tempType_2.spirvType._4_4_ = node_local._4_4_ + EOpPostIncrement;
        }
        TVar8 = tempType_2.spirvType._4_4_;
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar15 = (TSourceLoc *)
                  (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
        pTStack_e8 = TIntermediate::setAggregateOperator
                               (pTVar1,(TIntermNode *)loc_local,TVar8,(TType *)local_248,pTVar15);
      }
      this_local = (TParseContext *)
                   TIntermediate::addConversion
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              EbtInt8,pTStack_e8);
      TType::~TType((TType *)local_248);
      return (TIntermTyped *)this_local;
    }
    break;
  case EOpConstructUint8:
  case EOpConstructU8Vec2:
  case EOpConstructU8Vec3:
  case EOpConstructU8Vec4:
    newNode_1._4_4_ = EOpConstructUint8;
    bVar3 = TIntermediate::getArithemeticInt8Enabled
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    if ((!bVar3) && (iVar4 = (*(code *)loc_local->name[6]._M_string_length)(), iVar4 != 5)) {
      iVar4 = (*pTStack_20->_vptr_TType[0xc])();
      TType::TType((TType *)local_2e8,EbtUint,EvqTemporary,iVar4,0,0,false);
      pTStack_e8 = (TIntermTyped *)loc_local;
      pTVar10 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      bVar3 = TType::operator!=((TType *)local_2e8,pTVar10);
      if (bVar3) {
        if (node_local._4_4_ == EOpConstructUint8) {
          tempType_3.spirvType._4_4_ = EOpConstructUint;
        }
        else {
          tempType_3.spirvType._4_4_ = node_local._4_4_ + EOpPostIncrement;
        }
        TVar8 = tempType_3.spirvType._4_4_;
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar15 = (TSourceLoc *)
                  (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
        pTStack_e8 = TIntermediate::setAggregateOperator
                               (pTVar1,(TIntermNode *)loc_local,TVar8,(TType *)local_2e8,pTVar15);
      }
      this_local = (TParseContext *)
                   TIntermediate::addConversion
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              EbtUint8,pTStack_e8);
      TType::~TType((TType *)local_2e8);
      return (TIntermTyped *)this_local;
    }
    break;
  case EOpConstructInt16:
  case EOpConstructI16Vec2:
  case EOpConstructI16Vec3:
  case EOpConstructI16Vec4:
    newNode_1._4_4_ = EOpConstructInt16;
    bVar3 = TIntermediate::getArithemeticInt16Enabled
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    if ((!bVar3) && (iVar4 = (*(code *)loc_local->name[6]._M_string_length)(), iVar4 != 6)) {
      iVar4 = (*pTStack_20->_vptr_TType[0xc])();
      TType::TType((TType *)local_388,EbtInt,EvqTemporary,iVar4,0,0,false);
      pTStack_e8 = (TIntermTyped *)loc_local;
      pTVar10 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      bVar3 = TType::operator!=((TType *)local_388,pTVar10);
      if (bVar3) {
        if (node_local._4_4_ == EOpConstructInt16) {
          tempType_4.spirvType._4_4_ = EOpConstructInt;
        }
        else {
          tempType_4.spirvType._4_4_ = node_local._4_4_ + EOpParameters;
        }
        TVar8 = tempType_4.spirvType._4_4_;
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar15 = (TSourceLoc *)
                  (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
        pTStack_e8 = TIntermediate::setAggregateOperator
                               (pTVar1,(TIntermNode *)loc_local,TVar8,(TType *)local_388,pTVar15);
      }
      this_local = (TParseContext *)
                   TIntermediate::addConversion
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              EbtInt16,pTStack_e8);
      TType::~TType((TType *)local_388);
      return (TIntermTyped *)this_local;
    }
    break;
  case EOpConstructUint16:
  case EOpConstructU16Vec2:
  case EOpConstructU16Vec3:
  case EOpConstructU16Vec4:
    newNode_1._4_4_ = EOpConstructUint16;
    bVar3 = TIntermediate::getArithemeticInt16Enabled
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    if ((!bVar3) && (iVar4 = (*(code *)loc_local->name[6]._M_string_length)(), iVar4 != 7)) {
      iVar4 = (*pTStack_20->_vptr_TType[0xc])();
      TType::TType((TType *)local_428,EbtUint,EvqTemporary,iVar4,0,0,false);
      pTStack_e8 = (TIntermTyped *)loc_local;
      pTVar10 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      bVar3 = TType::operator!=((TType *)local_428,pTVar10);
      if (bVar3) {
        if (node_local._4_4_ == EOpConstructUint16) {
          newNode_4._4_4_ = EOpConstructUint;
        }
        else {
          newNode_4._4_4_ = node_local._4_4_ + EOpParameters;
        }
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar15 = (TSourceLoc *)
                  (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
        pTStack_e8 = TIntermediate::setAggregateOperator
                               (pTVar1,(TIntermNode *)loc_local,newNode_4._4_4_,(TType *)local_428,
                                pTVar15);
      }
      this_local = (TParseContext *)
                   TIntermediate::addConversion
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              EbtUint16,pTStack_e8);
      TType::~TType((TType *)local_428);
      return (TIntermTyped *)this_local;
    }
    break;
  case EOpConstructInt64:
  case EOpConstructI64Vec2:
  case EOpConstructI64Vec3:
  case EOpConstructI64Vec4:
    newNode_1._4_4_ = EOpConstructInt64;
    break;
  case EOpConstructUint64:
    uVar5 = (*pTStack_20->_vptr_TType[0x18])();
    if ((uVar5 & 1) != 0) {
      pTVar10 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      bVar3 = TType::isReference(pTVar10);
      if (bVar3) {
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar15 = (TSourceLoc *)
                  (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
        pTVar16 = (TParseContext *)
                  TIntermediate::addBuiltInFunctionCall
                            (pTVar1,pTVar15,EOpConvPtrToUint64,true,(TIntermNode *)loc_local,
                             pTStack_20);
        return (TIntermTyped *)pTVar16;
      }
    }
  case EOpConstructU64Vec2:
  case EOpConstructU64Vec3:
  case EOpConstructU64Vec4:
    newNode_1._4_4_ = EOpConstructUint64;
    break;
  case EOpConstructBool:
  case EOpConstructBVec2:
  case EOpConstructBVec3:
  case EOpConstructBVec4:
    newNode_1._4_4_ = EOpConstructBool;
    break;
  case EOpConstructFloat:
  case EOpConstructVec2:
  case EOpConstructVec3:
  case EOpConstructVec4:
  case EOpConstructMat2x2:
  case EOpConstructMat2x3:
  case EOpConstructMat2x4:
  case EOpConstructMat3x2:
  case EOpConstructMat3x3:
  case EOpConstructMat3x4:
  case EOpConstructMat4x2:
  case EOpConstructMat4x3:
  case EOpConstructMat4x4:
    newNode_1._4_4_ = EOpConstructFloat;
    break;
  case EOpConstructUVec2:
    plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    iVar4 = (**(code **)(*plVar14 + 0x38))();
    if (iVar4 == 0x12) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_EXT_buffer_reference_uvec2,"reference conversion to uvec2");
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar15 = (TSourceLoc *)
                (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
      pTVar16 = (TParseContext *)
                TIntermediate::addBuiltInFunctionCall
                          (pTVar1,pTVar15,EOpConvPtrToUvec2,true,(TIntermNode *)loc_local,pTStack_20
                          );
      return (TIntermTyped *)pTVar16;
    }
    plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    iVar4 = (**(code **)(*plVar14 + 0x38))();
    if (iVar4 == 0xe) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_ARB_bindless_texture,"sampler conversion to uvec2");
      pTVar12 = TIntermediate::createConversion
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,EbtUint
                           ,(TIntermTyped *)loc_local);
      iVar4 = (*(pTVar12->super_TIntermNode)._vptr_TIntermNode[3])();
      pTVar10 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0xf8))();
      TType::setVectorSize(pTVar10,2);
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar15 = (TSourceLoc *)
                (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
      pTVar16 = (TParseContext *)
                TIntermediate::addBuiltInFunctionCall
                          (pTVar1,pTVar15,EOpConstructUVec2,false,&pTVar12->super_TIntermNode,
                           pTStack_20);
      return (TIntermTyped *)pTVar16;
    }
  case EOpConstructUint:
  case EOpConstructUVec3:
  case EOpConstructUVec4:
    newNode_1._4_4_ = EOpConstructUint;
    break;
  default:
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"unsupported construction","");
    return (TIntermTyped *)(TParseContext *)0x0;
  case EOpConstructFloat16:
  case EOpConstructF16Vec2:
  case EOpConstructF16Vec3:
  case EOpConstructF16Vec4:
  case EOpConstructF16Mat2x2:
  case EOpConstructF16Mat2x3:
  case EOpConstructF16Mat2x4:
  case EOpConstructF16Mat3x2:
  case EOpConstructF16Mat3x3:
  case EOpConstructF16Mat3x4:
  case EOpConstructF16Mat4x2:
  case EOpConstructF16Mat4x3:
  case EOpConstructF16Mat4x4:
    newNode_1._4_4_ = EOpConstructFloat16;
    bVar3 = TIntermediate::getArithemeticFloat16Enabled
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    if ((!bVar3) && (iVar4 = (*(code *)loc_local->name[6]._M_string_length)(), iVar4 != 3)) {
      iVar4 = (*pTStack_20->_vptr_TType[0xc])();
      TType::TType((TType *)local_1a8,EbtFloat,EvqTemporary,iVar4,0,0,false);
      pTStack_e8 = (TIntermTyped *)loc_local;
      pTVar10 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      bVar3 = TType::operator!=((TType *)local_1a8,pTVar10);
      if (bVar3) {
        if (node_local._4_4_ == EOpConstructFloat16) {
          tempType_1.spirvType._4_4_ = EOpConstructFloat;
        }
        else {
          tempType_1.spirvType._4_4_ = node_local._4_4_ - EOpSign;
        }
        TVar8 = tempType_1.spirvType._4_4_;
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar15 = (TSourceLoc *)
                  (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
        pTStack_e8 = TIntermediate::setAggregateOperator
                               (pTVar1,(TIntermNode *)loc_local,TVar8,(TType *)local_1a8,pTVar15);
      }
      this_local = (TParseContext *)
                   TIntermediate::addConversion
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              EbtFloat16,pTStack_e8);
      TType::~TType((TType *)local_1a8);
      return (TIntermTyped *)this_local;
    }
    break;
  case EOpConstructTextureSampler:
    plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    iVar4 = (**(code **)(*plVar14 + 0x38))();
    if (iVar4 != 9) {
      plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      iVar4 = (**(code **)(*plVar14 + 0x38))();
      if (iVar4 != 8) goto switchD_00774cdf_caseD_17a;
    }
    plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    iVar4 = (**(code **)(*plVar14 + 0x60))();
    if (iVar4 == 2) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_ARB_bindless_texture,"ivec2/uvec2 convert to texture handle");
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar15 = (TSourceLoc *)
                (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
      pTVar16 = (TParseContext *)
                TIntermediate::addBuiltInFunctionCall
                          (pTVar1,pTVar15,EOpPackUint2x32,true,(TIntermNode *)loc_local,pTStack_20);
      return (TIntermTyped *)pTVar16;
    }
  case EOpConstructDouble:
  case EOpConstructDVec2:
  case EOpConstructDVec3:
  case EOpConstructDVec4:
  case EOpConstructDMat2x2:
  case EOpConstructDMat2x3:
  case EOpConstructDMat2x4:
  case EOpConstructDMat3x2:
  case EOpConstructDMat3x3:
  case EOpConstructDMat3x4:
  case EOpConstructDMat4x2:
  case EOpConstructDMat4x3:
  case EOpConstructDMat4x4:
switchD_00774cdf_caseD_17a:
    newNode_1._4_4_ = EOpConstructDouble;
    break;
  case EOpConstructNonuniform:
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar15 = (TSourceLoc *)
              (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
    pTVar16 = (TParseContext *)
              TIntermediate::addBuiltInFunctionCall
                        (pTVar1,pTVar15,EOpCopyObject,true,(TIntermNode *)loc_local,pTStack_20);
    return (TIntermTyped *)pTVar16;
  case EOpConstructReference:
    pTVar10 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    bVar3 = TType::isReference(pTVar10);
    if (bVar3) {
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar15 = (TSourceLoc *)
                (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
      pTVar16 = (TParseContext *)
                TIntermediate::addBuiltInFunctionCall
                          (pTVar1,pTVar15,EOpConstructReference,true,(TIntermNode *)loc_local,
                           pTStack_20);
      return (TIntermTyped *)pTVar16;
    }
    plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    uVar9 = (**(code **)(*plVar14 + 0xc0))();
    if ((uVar9 & 1) != 0) {
      plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      iVar4 = (**(code **)(*plVar14 + 0x38))();
      if (iVar4 == 0xb) {
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar15 = (TSourceLoc *)
                  (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
        pTVar16 = (TParseContext *)
                  TIntermediate::addBuiltInFunctionCall
                            (pTVar1,pTVar15,EOpConvUint64ToPtr,true,(TIntermNode *)loc_local,
                             pTStack_20);
        return (TIntermTyped *)pTVar16;
      }
    }
    plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    uVar9 = (**(code **)(*plVar14 + 0xd8))();
    if ((uVar9 & 1) != 0) {
      plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      iVar4 = (**(code **)(*plVar14 + 0x38))();
      if ((iVar4 == 9) &&
         (iVar4 = (*(code *)loc_local->name[7].field_2._M_allocated_capacity)(), iVar4 == 2)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,loc,1,&E_GL_EXT_buffer_reference_uvec2,"uvec2 conversion to reference");
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar15 = (TSourceLoc *)
                  (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
        pTVar16 = (TParseContext *)
                  TIntermediate::addBuiltInFunctionCall
                            (pTVar1,pTVar15,EOpConvUvec2ToPtr,true,(TIntermNode *)loc_local,
                             pTStack_20);
        return (TIntermTyped *)pTVar16;
      }
    }
    return (TIntermTyped *)(TParseContext *)0x0;
  case EOpConstructCooperativeMatrixNV:
  case EOpConstructCooperativeMatrixKHR:
    pTVar10 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    bVar3 = TType::operator==(pTVar10,pTStack_20);
    if (bVar3) {
      return (TIntermTyped *)(TParseContext *)loc_local;
    }
    pTVar10 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    bVar3 = TType::isCoopMat(pTVar10);
    pTVar10 = pTStack_20;
    if (bVar3) {
      pTVar11 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      bVar3 = TType::sameCoopMatShape(pTVar10,pTVar11);
      pTVar10 = pTStack_20;
      if (bVar3) {
        pTVar11 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)
                                     ();
        bVar3 = TType::sameCoopMatUse(pTVar10,pTVar11);
        if (!bVar3) {
          iVar4 = (*pTStack_20->_vptr_TType[7])();
          plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)
                                      ();
          iVar6 = (**(code **)(*plVar14 + 0x38))();
          pTVar10 = pTStack_20;
          TVar8 = node_local._4_4_;
          if (iVar4 == iVar6) {
            pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            pTVar15 = (TSourceLoc *)
                      (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
            pTVar12 = TIntermediate::setAggregateOperator
                                (pTVar1,(TIntermNode *)loc_local,TVar8,pTVar10,pTVar15);
            return pTVar12;
          }
        }
      }
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar15 = (TSourceLoc *)
                (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
      loc_local = (TSourceLoc *)
                  TIntermediate::addUnaryNode
                            (pTVar1,EOpConvNumeric,(TIntermTyped *)loc_local,pTVar15,pTStack_20);
      iVar4 = (*(((TIntermUnary *)loc_local)->super_TIntermOperator).super_TIntermTyped.
                super_TIntermNode._vptr_TIntermNode[7])();
      plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x188))();
      lVar13 = (**(code **)(*plVar14 + 0x28))();
      if (lVar13 != 0) {
        iVar4 = (*(((TIntermUnary *)loc_local)->super_TIntermOperator).super_TIntermTyped.
                  super_TIntermNode._vptr_TIntermNode[7])();
        plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x188))();
        plVar14 = (long *)(**(code **)(*plVar14 + 0x28))();
        iVar4 = (*(((TIntermUnary *)loc_local)->super_TIntermOperator).super_TIntermTyped.
                  super_TIntermNode._vptr_TIntermNode[0x1e])();
        pTVar16 = (TParseContext *)(**(code **)(*plVar14 + 0x188))(plVar14,0x12,iVar4);
        return (TIntermTyped *)pTVar16;
      }
    }
    else {
      iVar4 = (*pTStack_20->_vptr_TType[7])();
      plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      iVar6 = (**(code **)(*plVar14 + 0x38))();
      if (iVar4 != iVar6) {
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        TVar7 = (*pTStack_20->_vptr_TType[7])();
        loc_local = (TSourceLoc *)
                    TIntermediate::addConversion(pTVar1,TVar7,(TIntermTyped *)loc_local);
        if ((TIntermTyped *)loc_local == (TIntermTyped *)0x0) {
          return (TIntermTyped *)(TParseContext *)0x0;
        }
      }
      pTVar10 = pTStack_20;
      TVar8 = node_local._4_4_;
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar15 = (TSourceLoc *)
                (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
      loc_local = (TSourceLoc *)
                  TIntermediate::setAggregateOperator
                            (pTVar1,(TIntermNode *)loc_local,TVar8,pTVar10,pTVar15);
    }
    return (TIntermTyped *)(TParseContext *)loc_local;
  case EOpConstructCooperativeVectorNV:
    pTVar10 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    bVar3 = TType::isCoopVecNV(pTVar10);
    if (!bVar3) {
      iVar4 = (*pTStack_20->_vptr_TType[7])();
      plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      iVar6 = (**(code **)(*plVar14 + 0x38))();
      if (iVar4 != iVar6) {
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        TVar7 = (*pTStack_20->_vptr_TType[7])();
        loc_local = (TSourceLoc *)
                    TIntermediate::addConversion(pTVar1,TVar7,(TIntermTyped *)loc_local);
        if ((TIntermTyped *)loc_local == (TIntermTyped *)0x0) {
          return (TIntermTyped *)(TParseContext *)0x0;
        }
      }
    }
    iVar4 = (*pTStack_20->_vptr_TType[7])();
    plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    iVar6 = (**(code **)(*plVar14 + 0x38))();
    pTVar10 = pTStack_20;
    TVar8 = node_local._4_4_;
    if (iVar4 == iVar6) {
      if ((transitionType.spirvType._7_1_ & 1) == 0) {
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar15 = (TSourceLoc *)
                  (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
        pTVar16 = (TParseContext *)
                  TIntermediate::setAggregateOperator
                            (pTVar1,(TIntermNode *)loc_local,TVar8,pTVar10,pTVar15);
        return (TIntermTyped *)pTVar16;
      }
      return (TIntermTyped *)(TParseContext *)loc_local;
    }
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    TVar7 = (*pTStack_20->_vptr_TType[7])();
    plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    src = (**(code **)(*plVar14 + 0x38))();
    TIntermediate::buildConvertOp(pTVar1,TVar7,src,(TOperator *)((long)&node_local + 4));
    TVar8 = node_local._4_4_;
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar15 = (TSourceLoc *)
              (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
    pTVar16 = (TParseContext *)
              TIntermediate::addUnaryNode(pTVar1,TVar8,(TIntermTyped *)loc_local,pTVar15,pTStack_20)
    ;
    return (TIntermTyped *)pTVar16;
  case EOpConstructAccStruct:
    plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    uVar9 = (**(code **)(*plVar14 + 0xc0))();
    if ((uVar9 & 1) != 0) {
      plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      iVar4 = (**(code **)(*plVar14 + 0x38))();
      if (iVar4 == 0xb) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,loc,2,ray_tracing_EXTs,"uint64_t conversion to acclerationStructureEXT");
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar15 = (TSourceLoc *)
                  (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
        pTVar16 = (TParseContext *)
                  TIntermediate::addBuiltInFunctionCall
                            (pTVar1,pTVar15,EOpConvUint64ToAccStruct,true,(TIntermNode *)loc_local,
                             pTStack_20);
        return (TIntermTyped *)pTVar16;
      }
    }
    plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    uVar9 = (**(code **)(*plVar14 + 0xd8))();
    if ((uVar9 & 1) != 0) {
      plVar14 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      iVar4 = (**(code **)(*plVar14 + 0x38))();
      if ((iVar4 == 9) &&
         (iVar4 = (*(code *)loc_local->name[7].field_2._M_allocated_capacity)(), iVar4 == 2)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,loc,2,ray_tracing_EXTs,"uvec2 conversion to accelerationStructureEXT");
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar15 = (TSourceLoc *)
                  (*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)();
        pTVar16 = (TParseContext *)
                  TIntermediate::addBuiltInFunctionCall
                            (pTVar1,pTVar15,EOpConvUvec2ToAccStruct,true,(TIntermNode *)loc_local,
                             pTStack_20);
        return (TIntermTyped *)pTVar16;
      }
    }
    return (TIntermTyped *)(TParseContext *)0x0;
  }
  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  pTVar15 = (TSourceLoc *)(*(code *)(loc_local->name->_M_dataplus).super_allocator_type.allocator)()
  ;
  pTVar16 = (TParseContext *)
            TIntermediate::addUnaryMath(pTVar1,newNode_1._4_4_,(TIntermTyped *)loc_local,pTVar15);
  if (pTVar16 == (TParseContext *)0x0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can\'t convert","constructor","");
    this_local = (TParseContext *)0x0;
  }
  else {
    this_local = pTVar16;
    if ((transitionType.spirvType._7_1_ & 1) == 0) {
      if (pTVar16 != (TParseContext *)loc_local) {
        iVar4 = (*(pTVar16->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1e]
                )();
        bVar3 = TType::operator==((TType *)CONCAT44(extraout_var_04,iVar4),pTStack_20);
        if (bVar3) {
          return (TIntermTyped *)pTVar16;
        }
      }
      this_local = (TParseContext *)
                   TIntermediate::setAggregateOperator
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              (TIntermNode *)pTVar16,node_local._4_4_,pTStack_20,loc);
    }
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TParseContext::constructBuiltIn(const TType& type, TOperator op, TIntermTyped* node, const TSourceLoc& loc,
    bool subset)
{
    // If we are changing a matrix in both domain of basic type and to a non matrix,
    // do the shape change first (by default, below, basic type is changed before shape).
    // This avoids requesting a matrix of a new type that is going to be discarded anyway.
    // TODO: This could be generalized to more type combinations, but that would require
    // more extensive testing and full algorithm rework. For now, the need to do two changes makes
    // the recursive call work, and avoids the most egregious case of creating integer matrices.
    if (node->getType().isMatrix() && (type.isScalar() || type.isVector()) &&
            type.isFloatingDomain() != node->getType().isFloatingDomain()) {
        TType transitionType(node->getBasicType(), glslang::EvqTemporary, type.getVectorSize(), 0, 0, node->isVector());
        TOperator transitionOp = intermediate.mapTypeToConstructorOp(transitionType);
        node = constructBuiltIn(transitionType, transitionOp, node, loc, false);
    }

    TIntermTyped* newNode;
    TOperator basicOp;

    //
    // First, convert types as needed.
    //
    switch (op) {
    case EOpConstructVec2:
    case EOpConstructVec3:
    case EOpConstructVec4:
    case EOpConstructMat2x2:
    case EOpConstructMat2x3:
    case EOpConstructMat2x4:
    case EOpConstructMat3x2:
    case EOpConstructMat3x3:
    case EOpConstructMat3x4:
    case EOpConstructMat4x2:
    case EOpConstructMat4x3:
    case EOpConstructMat4x4:
    case EOpConstructFloat:
        basicOp = EOpConstructFloat;
        break;

    case EOpConstructIVec2:
    case EOpConstructIVec3:
    case EOpConstructIVec4:
    case EOpConstructInt:
        basicOp = EOpConstructInt;
        break;

    case EOpConstructUVec2:
        if (node->getType().getBasicType() == EbtReference) {
            requireExtensions(loc, 1, &E_GL_EXT_buffer_reference_uvec2, "reference conversion to uvec2");
            TIntermTyped* newNode = intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConvPtrToUvec2, true, node,
                type);
            return newNode;
        } else if (node->getType().getBasicType() == EbtSampler) {
            requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "sampler conversion to uvec2");
            // force the basic type of the constructor param to uvec2, otherwise spv builder will
            // report some errors
            TIntermTyped* newSrcNode = intermediate.createConversion(EbtUint, node);
            newSrcNode->getAsTyped()->getWritableType().setVectorSize(2);

            TIntermTyped* newNode =
                intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConstructUVec2, false, newSrcNode, type);
            return newNode;
        }
        [[fallthrough]];
    case EOpConstructUVec3:
    case EOpConstructUVec4:
    case EOpConstructUint:
        basicOp = EOpConstructUint;
        break;

    case EOpConstructBVec2:
    case EOpConstructBVec3:
    case EOpConstructBVec4:
    case EOpConstructBool:
        basicOp = EOpConstructBool;
        break;
    case EOpConstructTextureSampler:
        if ((node->getType().getBasicType() == EbtUint || node->getType().getBasicType() == EbtInt) &&
            node->getType().getVectorSize() == 2) {
            requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "ivec2/uvec2 convert to texture handle");
            // No matter ivec2 or uvec2, Set EOpPackUint2x32 just to generate an opBitcast op code
            TIntermTyped* newNode =
                intermediate.addBuiltInFunctionCall(node->getLoc(), EOpPackUint2x32, true, node, type);
            return newNode;
        }
        [[fallthrough]];
    case EOpConstructDVec2:
    case EOpConstructDVec3:
    case EOpConstructDVec4:
    case EOpConstructDMat2x2:
    case EOpConstructDMat2x3:
    case EOpConstructDMat2x4:
    case EOpConstructDMat3x2:
    case EOpConstructDMat3x3:
    case EOpConstructDMat3x4:
    case EOpConstructDMat4x2:
    case EOpConstructDMat4x3:
    case EOpConstructDMat4x4:
    case EOpConstructDouble:
        basicOp = EOpConstructDouble;
        break;

    case EOpConstructF16Vec2:
    case EOpConstructF16Vec3:
    case EOpConstructF16Vec4:
    case EOpConstructF16Mat2x2:
    case EOpConstructF16Mat2x3:
    case EOpConstructF16Mat2x4:
    case EOpConstructF16Mat3x2:
    case EOpConstructF16Mat3x3:
    case EOpConstructF16Mat3x4:
    case EOpConstructF16Mat4x2:
    case EOpConstructF16Mat4x3:
    case EOpConstructF16Mat4x4:
    case EOpConstructFloat16:
        basicOp = EOpConstructFloat16;
        // 8/16-bit storage extensions don't support direct constructing composites of 8/16-bit types,
        // so construct a 32-bit type and convert
        // and do not generate any conversion if it is an identity conversion, i.e. float16_t(<float16_t> var)
        if (!intermediate.getArithemeticFloat16Enabled() && (node->getBasicType() != EbtFloat16)) {
            TType tempType(EbtFloat, EvqTemporary, type.getVectorSize());
            newNode = node;
            if (tempType != newNode->getType()) {
                TOperator aggregateOp;
                if (op == EOpConstructFloat16)
                    aggregateOp = EOpConstructFloat;
                else
                    aggregateOp = (TOperator)(EOpConstructVec2 + op - EOpConstructF16Vec2);
                newNode = intermediate.setAggregateOperator(newNode, aggregateOp, tempType, node->getLoc());
            }
            newNode = intermediate.addConversion(EbtFloat16, newNode);
            return newNode;
        }
        break;

    case EOpConstructI8Vec2:
    case EOpConstructI8Vec3:
    case EOpConstructI8Vec4:
    case EOpConstructInt8:
        basicOp = EOpConstructInt8;
        // 8/16-bit storage extensions don't support direct constructing composites of 8/16-bit types,
        // so construct a 32-bit type and convert
        // and do not generate any conversion if it is an identity conversion, i.e. int8_t(<int8_t> var)
        if (!intermediate.getArithemeticInt8Enabled() && (node->getBasicType() != EbtInt8)) {
            TType tempType(EbtInt, EvqTemporary, type.getVectorSize());
            newNode = node;
            if (tempType != newNode->getType()) {
                TOperator aggregateOp;
                if (op == EOpConstructInt8)
                    aggregateOp = EOpConstructInt;
                else
                    aggregateOp = (TOperator)(EOpConstructIVec2 + op - EOpConstructI8Vec2);
                newNode = intermediate.setAggregateOperator(newNode, aggregateOp, tempType, node->getLoc());
            }
            newNode = intermediate.addConversion(EbtInt8, newNode);
            return newNode;
        }
        break;

    case EOpConstructU8Vec2:
    case EOpConstructU8Vec3:
    case EOpConstructU8Vec4:
    case EOpConstructUint8:
        basicOp = EOpConstructUint8;
        // 8/16-bit storage extensions don't support direct constructing composites of 8/16-bit types,
        // so construct a 32-bit type and convert
        // and do not generate any conversion if it is an identity conversion, i.e. uint8_t(<uint8_t> var)
        if (!intermediate.getArithemeticInt8Enabled() && (node->getBasicType() != EbtUint8)) {
            TType tempType(EbtUint, EvqTemporary, type.getVectorSize());
            newNode = node;
            if (tempType != newNode->getType()) {
                TOperator aggregateOp;
                if (op == EOpConstructUint8)
                    aggregateOp = EOpConstructUint;
                else
                    aggregateOp = (TOperator)(EOpConstructUVec2 + op - EOpConstructU8Vec2);
                newNode = intermediate.setAggregateOperator(newNode, aggregateOp, tempType, node->getLoc());
            }
            newNode = intermediate.addConversion(EbtUint8, newNode);
            return newNode;
        }
        break;

    case EOpConstructI16Vec2:
    case EOpConstructI16Vec3:
    case EOpConstructI16Vec4:
    case EOpConstructInt16:
        basicOp = EOpConstructInt16;
        // 8/16-bit storage extensions don't support direct constructing composites of 8/16-bit types,
        // so construct a 32-bit type and convert
        // and do not generate any conversion if it is an identity conversion, i.e. int16_t(<int16_t> var)
        if (!intermediate.getArithemeticInt16Enabled() && (node->getBasicType() != EbtInt16)) {
            TType tempType(EbtInt, EvqTemporary, type.getVectorSize());
            newNode = node;
            if (tempType != newNode->getType()) {
                TOperator aggregateOp;
                if (op == EOpConstructInt16)
                    aggregateOp = EOpConstructInt;
                else
                    aggregateOp = (TOperator)(EOpConstructIVec2 + op - EOpConstructI16Vec2);
                newNode = intermediate.setAggregateOperator(newNode, aggregateOp, tempType, node->getLoc());
            }
            newNode = intermediate.addConversion(EbtInt16, newNode);
            return newNode;
        }
        break;

    case EOpConstructU16Vec2:
    case EOpConstructU16Vec3:
    case EOpConstructU16Vec4:
    case EOpConstructUint16:
        basicOp = EOpConstructUint16;
        // 8/16-bit storage extensions don't support direct constructing composites of 8/16-bit types,
        // so construct a 32-bit type and convert
        // and do not generate any conversion if it is an identity conversion, i.e. uint16_t(<uint16_t> var)
        if (!intermediate.getArithemeticInt16Enabled() && (node->getBasicType() != EbtUint16)) {
            TType tempType(EbtUint, EvqTemporary, type.getVectorSize());
            newNode = node;
            if (tempType != newNode->getType()) {
                TOperator aggregateOp;
                if (op == EOpConstructUint16)
                    aggregateOp = EOpConstructUint;
                else
                    aggregateOp = (TOperator)(EOpConstructUVec2 + op - EOpConstructU16Vec2);
                newNode = intermediate.setAggregateOperator(newNode, aggregateOp, tempType, node->getLoc());
            }
            newNode = intermediate.addConversion(EbtUint16, newNode);
            return newNode;
        }
        break;

    case EOpConstructI64Vec2:
    case EOpConstructI64Vec3:
    case EOpConstructI64Vec4:
    case EOpConstructInt64:
        basicOp = EOpConstructInt64;
        break;

    case EOpConstructUint64:
        if (type.isScalar() && node->getType().isReference()) {
            TIntermTyped* newNode = intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConvPtrToUint64, true, node, type);
            return newNode;
        }
        [[fallthrough]];
    case EOpConstructU64Vec2:
    case EOpConstructU64Vec3:
    case EOpConstructU64Vec4:
        basicOp = EOpConstructUint64;
        break;

    case EOpConstructNonuniform:
        // Make a nonuniform copy of node
        newNode = intermediate.addBuiltInFunctionCall(node->getLoc(), EOpCopyObject, true, node, type);
        return newNode;

    case EOpConstructReference:
        // construct reference from reference
        if (node->getType().isReference()) {
            newNode = intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConstructReference, true, node, type);
            return newNode;
        // construct reference from uint64
        } else if (node->getType().isScalar() && node->getType().getBasicType() == EbtUint64) {
            TIntermTyped* newNode = intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConvUint64ToPtr, true, node,
                type);
            return newNode;
        // construct reference from uvec2
        } else if (node->getType().isVector() && node->getType().getBasicType() == EbtUint &&
                   node->getVectorSize() == 2) {
            requireExtensions(loc, 1, &E_GL_EXT_buffer_reference_uvec2, "uvec2 conversion to reference");
            TIntermTyped* newNode = intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConvUvec2ToPtr, true, node,
                type);
            return newNode;
        } else {
            return nullptr;
        }

    case EOpConstructCooperativeVectorNV:
        if (!node->getType().isCoopVecNV()) {
            if (type.getBasicType() != node->getType().getBasicType()) {
                node = intermediate.addConversion(type.getBasicType(), node);
                if (node == nullptr)
                    return nullptr;
            }
        }
        if (type.getBasicType() != node->getType().getBasicType()) {
            intermediate.buildConvertOp(type.getBasicType(), node->getType().getBasicType(), op);
            node = intermediate.addUnaryNode(op, node, node->getLoc(), type);
            return node;
        }
        if (subset) {
            return node;
        }

        node = intermediate.setAggregateOperator(node, op, type, node->getLoc());

        return node;

    case EOpConstructCooperativeMatrixNV:
    case EOpConstructCooperativeMatrixKHR:
        if (node->getType() == type) {
            return node;
        }
        if (!node->getType().isCoopMat()) {
            if (type.getBasicType() != node->getType().getBasicType()) {
                node = intermediate.addConversion(type.getBasicType(), node);
                if (node == nullptr)
                    return nullptr;
            }
            node = intermediate.setAggregateOperator(node, op, type, node->getLoc());
        } else if (type.sameCoopMatShape(node->getType()) && !type.sameCoopMatUse(node->getType()) &&
                   type.getBasicType() == node->getType().getBasicType()) {
            node = intermediate.setAggregateOperator(node, op, type, node->getLoc());
        } else {
            TOperator op = EOpConvNumeric;

            node = intermediate.addUnaryNode(op, node, node->getLoc(), type);
            // If it's a (non-specialization) constant, it must be folded.
            if (node->getAsUnaryNode()->getOperand()->getAsConstantUnion())
                return node->getAsUnaryNode()->getOperand()->getAsConstantUnion()->fold(op, node->getType());
        }

        return node;

    case EOpConstructAccStruct:
        if ((node->getType().isScalar() && node->getType().getBasicType() == EbtUint64)) {
            // construct acceleration structure from uint64
            requireExtensions(loc, Num_ray_tracing_EXTs, ray_tracing_EXTs, "uint64_t conversion to acclerationStructureEXT");
            return intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConvUint64ToAccStruct, true, node,
                type);
        } else if (node->getType().isVector() && node->getType().getBasicType() == EbtUint && node->getVectorSize() == 2) {
            // construct acceleration structure from uint64
            requireExtensions(loc, Num_ray_tracing_EXTs, ray_tracing_EXTs, "uvec2 conversion to accelerationStructureEXT");
            return intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConvUvec2ToAccStruct, true, node,
                type);
        } else
            return nullptr;

    default:
        error(loc, "unsupported construction", "", "");

        return nullptr;
    }
    newNode = intermediate.addUnaryMath(basicOp, node, node->getLoc());
    if (newNode == nullptr) {
        error(loc, "can't convert", "constructor", "");
        return nullptr;
    }

    //
    // Now, if there still isn't an operation to do the construction, and we need one, add one.
    //

    // Otherwise, skip out early.
    if (subset || (newNode != node && newNode->getType() == type))
        return newNode;

    // setAggregateOperator will insert a new node for the constructor, as needed.
    return intermediate.setAggregateOperator(newNode, op, type, loc);
}